

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-home-power.c
# Opt level: O0

int32_t borg_power_home_aux1(void)

{
  int iVar1;
  int local_c;
  int spell_stat;
  int32_t value;
  
  local_c = 0;
  if (num_LIGHT == 1) {
    local_c = 0x96;
  }
  else if (num_LIGHT == 2) {
    local_c = 0xaa;
  }
  else if (2 < num_LIGHT) {
    local_c = (num_LIGHT + -2) * 5 + 0xaa;
  }
  if (num_slow_digest == 1) {
    local_c = local_c + 0x32;
  }
  else if (num_slow_digest == 2) {
    local_c = local_c + 0x46;
  }
  else if (2 < num_slow_digest) {
    local_c = local_c + (num_slow_digest + -2) * 5 + 0x46;
  }
  if (num_regenerate == 1) {
    local_c = local_c + 0x4b;
  }
  else if (num_regenerate == 2) {
    local_c = local_c + 100;
  }
  else if (2 < num_regenerate) {
    local_c = local_c + (num_regenerate + -2) * 10 + 100;
  }
  if (num_telepathy == 1) {
    local_c = local_c + 1000;
  }
  else if (num_telepathy == 2) {
    local_c = local_c + 0x5dc;
  }
  else if (2 < num_telepathy) {
    local_c = local_c + (num_telepathy + -2) * 10 + 0x5dc;
  }
  if (num_see_inv == 1) {
    local_c = local_c + 800;
  }
  else if (num_see_inv == 2) {
    local_c = local_c + 0x4b0;
  }
  else if (2 < num_see_inv) {
    local_c = local_c + (num_see_inv + -2) * 10 + 0x4b0;
  }
  if (num_ffall == 1) {
    local_c = local_c + 10;
  }
  else if (num_ffall == 2) {
    local_c = local_c + 0xf;
  }
  else if (2 < num_ffall) {
    local_c = local_c + num_ffall + 0xd;
  }
  if (num_free_act == 1) {
    local_c = local_c + 1000;
  }
  else if (num_free_act == 2) {
    local_c = local_c + 0x5dc;
  }
  else if (2 < num_free_act) {
    local_c = local_c + (num_free_act + -2) * 10 + 0x5dc;
  }
  if (num_hold_life == 1) {
    local_c = local_c + 1000;
  }
  else if (num_hold_life == 2) {
    local_c = local_c + 0x5dc;
  }
  else if (2 < num_hold_life) {
    local_c = local_c + (num_hold_life + -2) * 10 + 0x5dc;
  }
  if (num_resist_acid == 1) {
    local_c = local_c + 1000;
  }
  else if (num_resist_acid == 2) {
    local_c = local_c + 0x5dc;
  }
  else if (2 < num_resist_acid) {
    local_c = local_c + num_resist_acid + 0x5da;
  }
  if (num_immune_acid == 1) {
    local_c = local_c + 3000;
  }
  else if (num_immune_acid == 2) {
    local_c = local_c + 5000;
  }
  else if (2 < num_immune_acid) {
    local_c = local_c + (num_immune_acid + -2) * 0x1e + 5000;
  }
  if (num_resist_elec == 1) {
    local_c = local_c + 1000;
  }
  else if (num_resist_elec == 2) {
    local_c = local_c + 0x5dc;
  }
  else if (2 < num_resist_elec) {
    local_c = local_c + num_resist_elec + 0x5da;
  }
  if (num_immune_elec == 1) {
    local_c = local_c + 3000;
  }
  else if (num_immune_elec == 2) {
    local_c = local_c + 5000;
  }
  else if (2 < num_immune_elec) {
    local_c = local_c + (num_immune_elec + -2) * 0x1e + 5000;
  }
  if (num_resist_fire == 1) {
    local_c = local_c + 1000;
  }
  else if (num_resist_fire == 2) {
    local_c = local_c + 0x5dc;
  }
  else if (2 < num_resist_fire) {
    local_c = local_c + num_resist_fire + 0x5da;
  }
  if (num_immune_fire == 1) {
    local_c = local_c + 3000;
  }
  else if (num_immune_fire == 2) {
    local_c = local_c + 5000;
  }
  else if (2 < num_immune_fire) {
    local_c = local_c + (num_immune_fire + -2) * 0x1e + 5000;
  }
  if (num_resist_cold == 1) {
    local_c = local_c + 1000;
  }
  else if (num_resist_cold == 2) {
    local_c = local_c + 0x5dc;
  }
  else if (2 < num_resist_cold) {
    local_c = local_c + num_resist_cold + 0x5da;
  }
  if (num_immune_cold == 1) {
    local_c = local_c + 3000;
  }
  else if (num_immune_cold == 2) {
    local_c = local_c + 5000;
  }
  else if (2 < num_immune_cold) {
    local_c = local_c + (num_immune_cold + -2) * 0x1e + 5000;
  }
  if (num_resist_pois == 1) {
    local_c = local_c + 5000;
  }
  else if (num_resist_pois == 2) {
    local_c = local_c + 9000;
  }
  else if (2 < num_resist_pois) {
    local_c = local_c + (num_resist_pois + -2) * 0x28 + 9000;
  }
  if (num_resist_conf == 1) {
    local_c = local_c + 2000;
  }
  else if (num_resist_conf == 2) {
    local_c = local_c + 8000;
  }
  else if (2 < num_resist_conf) {
    local_c = local_c + (num_resist_conf + -2) * 0x2d + 8000;
  }
  if (num_resist_sound == 1) {
    local_c = local_c + 500;
  }
  else if (num_resist_sound == 2) {
    local_c = local_c + 700;
  }
  else if (2 < num_resist_sound) {
    local_c = local_c + (num_resist_sound + -2) * 0x1e + 700;
  }
  if (num_resist_LIGHT == 1) {
    local_c = local_c + 100;
  }
  else if (num_resist_LIGHT == 2) {
    local_c = local_c + 0x96;
  }
  else if (2 < num_resist_LIGHT) {
    local_c = local_c + num_resist_LIGHT + 0x94;
  }
  if (num_resist_dark == 1) {
    local_c = local_c + 100;
  }
  else if (num_resist_dark == 2) {
    local_c = local_c + 0x96;
  }
  else if (2 < num_resist_dark) {
    local_c = local_c + num_resist_dark + 0x94;
  }
  if (num_resist_chaos == 1) {
    local_c = local_c + 1000;
  }
  else if (num_resist_chaos == 2) {
    local_c = local_c + 0x5dc;
  }
  else if (2 < num_resist_chaos) {
    local_c = local_c + (num_resist_chaos + -2) * 10 + 0x5dc;
  }
  if (num_resist_disen == 1) {
    local_c = local_c + 5000;
  }
  else if (num_resist_disen == 2) {
    local_c = local_c + 7000;
  }
  else if (2 < num_resist_disen) {
    local_c = local_c + (num_resist_disen + -2) * 0x23 + 7000;
  }
  if (num_resist_shard == 1) {
    local_c = local_c + 100;
  }
  else if (num_resist_shard == 2) {
    local_c = local_c + 0x96;
  }
  else if (2 < num_resist_shard) {
    local_c = local_c + num_resist_shard + 0x94;
  }
  if (num_resist_nexus == 1) {
    local_c = local_c + 200;
  }
  else if (num_resist_nexus == 2) {
    local_c = local_c + 300;
  }
  else if (2 < num_resist_nexus) {
    local_c = local_c + (num_resist_nexus + -2) * 2 + 300;
  }
  if (num_resist_blind == 1) {
    local_c = local_c + 500;
  }
  else if (num_resist_blind == 2) {
    local_c = local_c + 1000;
  }
  else if (2 < num_resist_blind) {
    local_c = local_c + (num_resist_blind + -2) * 5 + 1000;
  }
  if (num_resist_neth == 1) {
    local_c = local_c + 3000;
  }
  else if (num_resist_neth == 2) {
    local_c = local_c + 4000;
  }
  else if (2 < num_resist_neth) {
    local_c = local_c + (num_resist_neth + -2) * 0x2d + 4000;
  }
  if (home_stat_add[0] < 9) {
    iVar1 = home_stat_add[0] * 300;
  }
  else if (home_stat_add[0] < 0xf) {
    iVar1 = (home_stat_add[0] + -9) * 200 + 0xa8c;
  }
  else {
    iVar1 = home_stat_add[0] + 0xf2d;
  }
  local_c = local_c + iVar1;
  if (home_stat_add[3] < 9) {
    iVar1 = home_stat_add[3] * 300;
  }
  else if (home_stat_add[3] < 0xf) {
    iVar1 = (home_stat_add[3] + -9) * 200 + 0xa8c;
  }
  else {
    iVar1 = home_stat_add[3] + 0xf2d;
  }
  local_c = local_c + iVar1;
  if (home_stat_add[4] < 0xf) {
    iVar1 = home_stat_add[4] * 300;
  }
  else if (home_stat_add[4] < 0x15) {
    iVar1 = (home_stat_add[4] + -0xf) * 200 + 0x1194;
  }
  else {
    iVar1 = home_stat_add[4] + 0x162f;
  }
  local_c = local_c + iVar1;
  iVar1 = borg_spell_stat();
  if (-1 < iVar1) {
    if (home_stat_add[iVar1] < 0x14) {
      iVar1 = home_stat_add[iVar1] * 400;
    }
    else if (home_stat_add[iVar1] < 0x1a) {
      iVar1 = (home_stat_add[iVar1] + -0x14) * 300 + 8000;
    }
    else {
      iVar1 = (home_stat_add[iVar1] + -0x1a) * 5 + 0xed8;
    }
    local_c = local_c + iVar1;
  }
  if (num_sustain_str == 1) {
    local_c = local_c + 200;
  }
  else if (num_sustain_str == 2) {
    local_c = local_c + 0xfa;
  }
  else if (2 < num_sustain_str) {
    local_c = local_c + num_sustain_str + 0xf8;
  }
  if (num_sustain_int == 1) {
    local_c = local_c + 200;
  }
  else if (num_sustain_int == 2) {
    local_c = local_c + 0xfa;
  }
  else if (2 < num_sustain_int) {
    local_c = local_c + num_sustain_int + 0xf8;
  }
  if (num_sustain_wis == 1) {
    local_c = local_c + 200;
  }
  else if (num_sustain_wis == 2) {
    local_c = local_c + 0xfa;
  }
  else if (2 < num_sustain_wis) {
    local_c = local_c + num_sustain_wis + 0xf8;
  }
  if (num_sustain_con == 1) {
    local_c = local_c + 200;
  }
  else if (num_sustain_con == 2) {
    local_c = local_c + 0xfa;
  }
  else if (2 < num_sustain_con) {
    local_c = local_c + num_sustain_con + 0xf8;
  }
  if (num_sustain_dex == 1) {
    local_c = local_c + 200;
  }
  else if (num_sustain_dex == 2) {
    local_c = local_c + 0xfa;
  }
  else if (2 < num_sustain_dex) {
    local_c = local_c + num_sustain_dex + 0xf8;
  }
  if (num_sustain_all == 1) {
    local_c = local_c + 1000;
  }
  else if (num_sustain_all == 2) {
    local_c = local_c + 0x5dc;
  }
  else if (2 < num_sustain_all) {
    local_c = local_c + num_sustain_all + 0x5da;
  }
  if (num_weapons < 6) {
    if (1 < num_weapons) {
      local_c = local_c + (num_weapons + -1) * -100;
    }
  }
  else {
    local_c = local_c + (num_weapons + -5) * -2000;
  }
  if (2 < num_bow) {
    local_c = local_c + (num_bow + -2) * -1000;
  }
  if (num_rings < 7) {
    if (4 < num_rings) {
      local_c = local_c + (num_rings + -4) * -2000;
    }
  }
  else {
    local_c = local_c + (num_rings + -6) * -4000;
  }
  if (num_neck < 4) {
    if (3 < num_neck) {
      local_c = local_c + (num_neck + -3) * -700;
    }
  }
  else {
    local_c = local_c + (num_neck + -3) * -0x5dc;
  }
  if (6 < num_armor) {
    local_c = local_c + (num_armor + -6) * -1000;
  }
  if (3 < num_cloaks) {
    local_c = local_c + (num_cloaks + -3) * -1000;
  }
  if (3 < num_shields) {
    local_c = local_c + (num_shields + -3) * -1000;
  }
  if (4 < num_hats) {
    local_c = local_c + (num_hats + -4) * -1000;
  }
  if (3 < num_gloves) {
    local_c = local_c + (num_gloves + -3) * -1000;
  }
  if (3 < num_boots) {
    local_c = local_c + (num_boots + -3) * -1000;
  }
  return home_damage + local_c + num_edged_weapon * -0x32 + num_bad_gloves * -3000 +
         num_duplicate_items * -50000;
}

Assistant:

static int32_t borg_power_home_aux1(void)
{
    int32_t value = 0L;

    /* This would be better separated by item type (so 1 bonus for resist cold
     * armor */
    /*   1 bonus for resist cold shield... but that would take a bunch more
     * code. */

    /* try to collect at least 2 of each resist/power (for swapping) */
    /* This can be used to get rid of extra artifacts... */

    /* spare lite sources.  Artifacts only */
    if (num_LIGHT == 1)
        value += 150L;
    else if (num_LIGHT == 2)
        value += 170L;
    else if (num_LIGHT > 2)
        value += 170L + (num_LIGHT - 2) * 5L;

    if (num_slow_digest == 1)
        value += 50L;
    else if (num_slow_digest == 2)
        value += 70L;
    else if (num_slow_digest > 2)
        value += 70L + (num_slow_digest - 2) * 5L;

    if (num_regenerate == 1)
        value += 75L;
    else if (num_regenerate == 2)
        value += 100L;
    else if (num_regenerate > 2)
        value += 100L + (num_regenerate - 2) * 10L;

    if (num_telepathy == 1)
        value += 1000L;
    else if (num_telepathy == 2)
        value += 1500L;
    else if (num_telepathy > 2)
        value += 1500L + (num_telepathy - 2) * 10L;

    if (num_see_inv == 1)
        value += 800L;
    else if (num_see_inv == 2)
        value += 1200L;
    else if (num_see_inv > 2)
        value += 1200L + (num_see_inv - 2) * 10L;

    if (num_ffall == 1)
        value += 10L;
    else if (num_ffall == 2)
        value += 15L;
    else if (num_ffall > 2)
        value += 15L + (num_ffall - 2) * 1L;

    if (num_free_act == 1)
        value += 1000L;
    else if (num_free_act == 2)
        value += 1500L;
    else if (num_free_act > 2)
        value += 1500L + (num_free_act - 2) * 10L;

    if (num_hold_life == 1)
        value += 1000L;
    else if (num_hold_life == 2)
        value += 1500L;
    else if (num_hold_life > 2)
        value += 1500L + (num_hold_life - 2) * 10L;

    if (num_resist_acid == 1)
        value += 1000L;
    else if (num_resist_acid == 2)
        value += 1500L;
    else if (num_resist_acid > 2)
        value += 1500L + (num_resist_acid - 2) * 1L;
    if (num_immune_acid == 1)
        value += 3000L;
    else if (num_immune_acid == 2)
        value += 5000L;
    else if (num_immune_acid > 2)
        value += 5000L + (num_immune_acid - 2) * 30L;

    if (num_resist_elec == 1)
        value += 1000L;
    else if (num_resist_elec == 2)
        value += 1500L;
    else if (num_resist_elec > 2)
        value += 1500L + (num_resist_elec - 2) * 1L;
    if (num_immune_elec == 1)
        value += 3000L;
    else if (num_immune_elec == 2)
        value += 5000L;
    else if (num_immune_elec > 2)
        value += 5000L + (num_immune_elec - 2) * 30L;

    if (num_resist_fire == 1)
        value += 1000L;
    else if (num_resist_fire == 2)
        value += 1500L;
    else if (num_resist_fire > 2)
        value += 1500L + (num_resist_fire - 2) * 1L;
    if (num_immune_fire == 1)
        value += 3000L;
    else if (num_immune_fire == 2)
        value += 5000L;
    else if (num_immune_fire > 2)
        value += 5000L + (num_immune_fire - 2) * 30L;

    if (num_resist_cold == 1)
        value += 1000L;
    else if (num_resist_cold == 2)
        value += 1500L;
    else if (num_resist_cold > 2)
        value += 1500L + (num_resist_cold - 2) * 1L;
    if (num_immune_cold == 1)
        value += 3000L;
    else if (num_immune_cold == 2)
        value += 5000L;
    else if (num_immune_cold > 2)
        value += 5000L + (num_immune_cold - 2) * 30L;

    if (num_resist_pois == 1)
        value += 5000L;
    else if (num_resist_pois == 2)
        value += 9000L;
    else if (num_resist_pois > 2)
        value += 9000L + (num_resist_pois - 2) * 40L;

    if (num_resist_conf == 1)
        value += 2000L;
    else if (num_resist_conf == 2)
        value += 8000L;
    else if (num_resist_conf > 2)
        value += 8000L + (num_resist_conf - 2) * 45L;

    if (num_resist_sound == 1)
        value += 500L;
    else if (num_resist_sound == 2)
        value += 700L;
    else if (num_resist_sound > 2)
        value += 700L + (num_resist_sound - 2) * 30L;

    if (num_resist_LIGHT == 1)
        value += 100L;
    else if (num_resist_LIGHT == 2)
        value += 150L;
    else if (num_resist_LIGHT > 2)
        value += 150L + (num_resist_LIGHT - 2) * 1L;

    if (num_resist_dark == 1)
        value += 100L;
    else if (num_resist_dark == 2)
        value += 150L;
    else if (num_resist_dark > 2)
        value += 150L + (num_resist_dark - 2) * 1L;

    if (num_resist_chaos == 1)
        value += 1000L;
    else if (num_resist_chaos == 2)
        value += 1500L;
    else if (num_resist_chaos > 2)
        value += 1500L + (num_resist_chaos - 2) * 10L;

    if (num_resist_disen == 1)
        value += 5000L;
    else if (num_resist_disen == 2)
        value += 7000L;
    else if (num_resist_disen > 2)
        value += 7000L + (num_resist_disen - 2) * 35L;

    if (num_resist_shard == 1)
        value += 100L;
    else if (num_resist_shard == 2)
        value += 150L;
    else if (num_resist_shard > 2)
        value += 150L + (num_resist_shard - 2) * 1L;

    if (num_resist_nexus == 1)
        value += 200L;
    else if (num_resist_nexus == 2)
        value += 300L;
    else if (num_resist_nexus > 2)
        value += 300L + (num_resist_nexus - 2) * 2L;

    if (num_resist_blind == 1)
        value += 500L;
    else if (num_resist_blind == 2)
        value += 1000L;
    else if (num_resist_blind > 2)
        value += 1000L + (num_resist_blind - 2) * 5L;

    if (num_resist_neth == 1)
        value += 3000L;
    else if (num_resist_neth == 2)
        value += 4000L;
    else if (num_resist_neth > 2)
        value += 4000L + (num_resist_neth - 2) * 45L;

    /* stat gain items as well...(good to carry ring of dex +6 in */
    /*                            house even if I don't need it right now) */
    if (home_stat_add[STAT_STR] < 9)
        value += home_stat_add[STAT_STR] * 300L;
    else if (home_stat_add[STAT_STR] < 15)
        value += 9 * 300L + (home_stat_add[STAT_STR] - 9) * 200L;
    else
        value += 9 * 300L + 6 * 200L + (home_stat_add[STAT_STR] - 15) * 1L;

    if (home_stat_add[STAT_DEX] < 9)
        value += home_stat_add[STAT_DEX] * 300L;
    else if (home_stat_add[STAT_DEX] < 15)
        value += 9 * 300L + (home_stat_add[STAT_DEX] - 9) * 200L;
    else
        value += 9 * 300L + 6 * 200L + (home_stat_add[STAT_DEX] - 15) * 1L;

    /* HACK extra con for thorin and other such things */
    if (home_stat_add[STAT_CON] < 15)
        value += home_stat_add[STAT_CON] * 300L;
    else if (home_stat_add[STAT_CON] < 21)
        value += 15 * 300L + (home_stat_add[STAT_CON] - 15) * 200L;
    else
        value += 15 * 300L + 6 * 200L + (home_stat_add[STAT_CON] - 21) * 1L;

    /* spell stat is only bonused for spell casters. */
    int spell_stat = borg_spell_stat();
    if (spell_stat >= 0) {
        if (home_stat_add[spell_stat] < 20)
            value += home_stat_add[spell_stat] * 400L;
        else if (home_stat_add[spell_stat] < 26)
            value += 20 * 400L + (home_stat_add[spell_stat] - 20) * 300L;
        else
            value
                += 20 * 100L + 6 * 300L + (home_stat_add[spell_stat] - 26) * 5L;
    }

    /* Sustains */
    if (num_sustain_str == 1)
        value += 200L;
    else if (num_sustain_str == 2)
        value += 250L;
    else if (num_sustain_str > 2)
        value += 250L + (num_sustain_str - 2) * 1L;

    if (num_sustain_int == 1)
        value += 200L;
    else if (num_sustain_int == 2)
        value += 250L;
    else if (num_sustain_int > 2)
        value += 250L + (num_sustain_int - 2) * 1L;

    if (num_sustain_wis == 1)
        value += 200L;
    else if (num_sustain_wis == 2)
        value += 250L;
    else if (num_sustain_wis > 2)
        value += 250L + (num_sustain_wis - 2) * 1L;

    if (num_sustain_con == 1)
        value += 200L;
    else if (num_sustain_con == 2)
        value += 250L;
    else if (num_sustain_con > 2)
        value += 250L + (num_sustain_con - 2) * 1L;

    if (num_sustain_dex == 1)
        value += 200L;
    else if (num_sustain_dex == 2)
        value += 250L;
    else if (num_sustain_dex > 2)
        value += 250L + (num_sustain_dex - 2) * 1L;

    if (num_sustain_all == 1)
        value += 1000L;
    else if (num_sustain_all == 2)
        value += 1500L;
    else if (num_sustain_all > 2)
        value += 1500L + (num_sustain_all - 2) * 1L;

    /* do a minus for too many duplicates.  This way we do not store */
    /* useless items and spread out types of items. */
    if (num_weapons > 5)
        value -= (num_weapons - 5) * 2000L;
    else if (num_weapons > 1)
        value -= (num_weapons - 1) * 100L;
    if (num_bow > 2)
        value -= (num_bow - 2) * 1000L;
    if (num_rings > 6)
        value -= (num_rings - 6) * 4000L;
    else if (num_rings > 4)
        value -= (num_rings - 4) * 2000L;
    if (num_neck > 3)
        value -= (num_neck - 3) * 1500L;
    else if (num_neck > 3)
        value -= (num_neck - 3) * 700L;
    if (num_armor > 6)
        value -= (num_armor - 6) * 1000L;
    if (num_cloaks > 3)
        value -= (num_cloaks - 3) * 1000L;
    if (num_shields > 3)
        value -= (num_shields - 3) * 1000L;
    if (num_hats > 4)
        value -= (num_hats - 4) * 1000L;
    if (num_gloves > 3)
        value -= (num_gloves - 3) * 1000L;
    if (num_boots > 3)
        value -= (num_boots - 3) * 1000L;

    value += home_damage;

    /* if edged and priest, small penalty   */
    value -= num_edged_weapon * 50L;

    /* if gloves and mage or ranger and not FA/Dex, dump it. */
    value -= num_bad_gloves * 3000L;

    /* do not allow duplication of items. */
    value -= num_duplicate_items * 50000L;

    /* Return the value */
    return (value);
}